

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O0

xmlXPathObjectPtr xmlXPtrNewLocationSetNodeSet(xmlNodeSetPtr set)

{
  xmlLocationSetPtr cur;
  xmlXPathObjectPtr val;
  xmlLocationSetPtr newset;
  int i;
  xmlXPathObjectPtr ret;
  xmlNodeSetPtr set_local;
  
  set_local = (xmlNodeSetPtr)(*xmlMalloc)(0x48);
  if (set_local == (xmlNodeSetPtr)0x0) {
    xmlXPtrErrMemory("allocating locationset");
    set_local = (xmlNodeSetPtr)0x0;
  }
  else {
    memset(set_local,0,0x48);
    set_local->nodeNr = 7;
    if ((set != (xmlNodeSetPtr)0x0) &&
       (cur = xmlXPtrLocationSetCreate((xmlXPathObjectPtr)0x0), cur != (xmlLocationSetPtr)0x0)) {
      for (newset._4_4_ = 0; newset._4_4_ < set->nodeNr; newset._4_4_ = newset._4_4_ + 1) {
        val = xmlXPtrNewCollapsedRange(set->nodeTab[newset._4_4_]);
        xmlXPtrLocationSetAdd(cur,val);
      }
      set_local[2].nodeTab = (xmlNodePtr *)cur;
    }
  }
  return (xmlXPathObjectPtr)set_local;
}

Assistant:

xmlXPathObjectPtr
xmlXPtrNewLocationSetNodeSet(xmlNodeSetPtr set) {
    xmlXPathObjectPtr ret;

    ret = (xmlXPathObjectPtr) xmlMalloc(sizeof(xmlXPathObject));
    if (ret == NULL) {
        xmlXPtrErrMemory("allocating locationset");
	return(NULL);
    }
    memset(ret, 0 , (size_t) sizeof(xmlXPathObject));
    ret->type = XPATH_LOCATIONSET;
    if (set != NULL) {
	int i;
	xmlLocationSetPtr newset;

	newset = xmlXPtrLocationSetCreate(NULL);
	if (newset == NULL)
	    return(ret);

	for (i = 0;i < set->nodeNr;i++)
	    xmlXPtrLocationSetAdd(newset,
		        xmlXPtrNewCollapsedRange(set->nodeTab[i]));

	ret->user = (void *) newset;
    }
    return(ret);
}